

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O2

void mbedtls_ssl_reset_in_out_pointers(mbedtls_ssl_context *ssl)

{
  uchar *puVar1;
  uchar *puVar2;
  
  puVar1 = ssl->out_buf;
  if (ssl->conf->transport == '\x01') {
    puVar2 = ssl->in_buf;
  }
  else {
    ssl->out_ctr = puVar1;
    puVar1 = puVar1 + 8;
    puVar2 = ssl->in_buf + 8;
  }
  ssl->out_hdr = puVar1;
  ssl->in_hdr = puVar2;
  mbedtls_ssl_update_out_pointers(ssl,(mbedtls_ssl_transform *)0x0);
  mbedtls_ssl_update_in_pointers(ssl);
  return;
}

Assistant:

void mbedtls_ssl_reset_in_out_pointers(mbedtls_ssl_context *ssl)
{
    /* Set the incoming and outgoing record pointers. */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if (ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM) {
        ssl->out_hdr = ssl->out_buf;
        ssl->in_hdr  = ssl->in_buf;
    } else
#endif /* MBEDTLS_SSL_PROTO_DTLS */
    {
        ssl->out_ctr = ssl->out_buf;
        ssl->out_hdr = ssl->out_buf + 8;
        ssl->in_hdr  = ssl->in_buf  + 8;
    }

    /* Derive other internal pointers. */
    mbedtls_ssl_update_out_pointers(ssl, NULL /* no transform enabled */);
    mbedtls_ssl_update_in_pointers(ssl);
}